

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<TestType,false,std::allocator<unsigned_long>>::
indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<TestType,false,std::allocator<unsigned_long>> *this,size_t index,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          outit)

{
  long lVar1;
  long lVar2;
  runtime_error *this_00;
  ulong uVar3;
  ulong uVar4;
  
  View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<TestType,_false,_std::allocator<unsigned_long>_> *)this);
  if (*(long *)this == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else if (*(long *)(this + 0x28) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else if (index < *(ulong *)(this + 0x30)) {
    View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
              ((View<TestType,_false,_std::allocator<unsigned_long>_> *)this);
    lVar1 = *(long *)this;
    if (*(int *)(this + 0x38) == 0) {
      if (lVar1 != 0) {
        lVar2 = *(long *)(this + 0x18);
        uVar4 = 0;
        do {
          if (*(ulong *)(this + 0x28) <= uVar4) {
            return;
          }
          if (*(ulong *)(this + 0x28) <= uVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0022e341;
          }
          outit._M_current[uVar4] = index / *(ulong *)(lVar2 + uVar4 * 8);
          if (*(ulong *)(this + 0x28) <= uVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0022e341;
          }
          index = index % *(ulong *)(lVar2 + uVar4 * 8);
          uVar4 = uVar4 + 1;
        } while (lVar1 != 0);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else if (lVar1 == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else {
      if (*(long *)(this + 0x28) != 0) {
        lVar1 = *(long *)(this + 0x18);
        uVar4 = *(long *)(this + 0x28) - 1;
        do {
          outit._M_current[uVar4] = index / *(ulong *)(lVar1 + uVar4 * 8);
          if (*(ulong *)(this + 0x28) <= uVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_0022e341;
          }
          uVar3 = uVar4 - 1;
          if (uVar4 == 0) {
            return;
          }
          index = index % *(ulong *)(lVar1 + uVar4 * 8);
          uVar4 = uVar3;
        } while (uVar3 < *(ulong *)(this + 0x28));
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
LAB_0022e341:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
View<T, isConst, A>::indexToCoordinates
(
    std::size_t index, // copy to work on
    CoordinateIterator outit
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || this->dimension() > 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index < this->size());
    if(coordinateOrder() == FirstMajorOrder) {
        for(std::size_t j=0; j<this->dimension(); ++j, ++outit) {
            *outit = std::size_t(index / geometry_.shapeStrides(j));
            index = index % geometry_.shapeStrides(j);
        }
    }
    else { // last major order
        std::size_t j = this->dimension()-1;
        outit += j;
        for(;;) {
            *outit = std::size_t(index / geometry_.shapeStrides(j));
            index = index % geometry_.shapeStrides(j);
            if(j == 0) {
                break;
            }
            else {
                --outit;
                --j;
            }
        }
    }
}